

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O3

void __thiscall
test_impl::
R<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
::oops<int>(R<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
            *this,int *u)

{
  char *pcVar1;
  undefined8 in_RAX;
  size_t sVar2;
  ostream *poVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"> ERROR: CHECK failed \"",0x17);
  pcVar1 = this->expr_;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x110100);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"> \t",3);
  pcVar1 = this->filename_;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x110100);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar2);
  }
  uStack_28._0_5_ = CONCAT14(0x28,(undefined4)uStack_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)((long)&uStack_28 + 4),1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->lineno_);
  uStack_28._0_6_ = CONCAT15(0x29,(undefined5)uStack_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_28 + 5),1);
  uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_28 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"> \t in function \"",0x11);
  pcVar1 = this->func_;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
  if (this->dismissed_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"> \tEXPECTED: ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,*u);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n> \tACTUAL: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<non-streamable type>",0x15);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 7),1);
  }
  test_failures()::test_failures = test_failures()::test_failures + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }